

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

_func_DescriptorDatabaseTestCase_ptr ** __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>
::Iterator::Current(Iterator *this)

{
  _func_DescriptorDatabaseTestCase_ptr **pp_Var1;
  
  if ((this->value_)._M_t.
      super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const)(),_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const)()>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const_*)(),_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const)()>_>
      .
      super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const_*)(),_false>
      ._M_head_impl == (_func_DescriptorDatabaseTestCase_ptr **)0x0) {
    pp_Var1 = (_func_DescriptorDatabaseTestCase_ptr **)operator_new(8);
    *pp_Var1 = *(this->iterator_)._M_current;
    (this->value_)._M_t.
    super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const)(),_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const)()>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const_*)(),_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const)()>_>
    .
    super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const_*)(),_false>
    ._M_head_impl = pp_Var1;
  }
  return (this->value_)._M_t.
         super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const)(),_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const)()>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const_*)(),_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const)()>_>
         .
         super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const_*)(),_false>
         ._M_head_impl;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }